

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

u32 utilNonce32(void)

{
  uint uVar1;
  long lVar2;
  tm_ticks_t curticks;
  tm_time_t curtime;
  tm_ticks_t local_20;
  tm_time_t local_18;
  
  lVar2 = 0;
  local_18 = tmTime();
  uVar1 = 0x811c9dc5;
  do {
    uVar1 = (*(byte *)((long)&local_18 + lVar2) ^ uVar1) * 0x1000193;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  lVar2 = 0;
  local_20 = tmTicks();
  do {
    uVar1 = (*(byte *)((long)&local_20 + lVar2) ^ uVar1) * 0x1000193;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return uVar1;
}

Assistant:

u32 utilNonce32()
{
	tm_time_t curtime;
	tm_ticks_t curticks;
	register u32 state = 2166136261u;
	// UNIX-время
	curtime = tmTime();
	state = utilFNV32(&curtime, sizeof(curtime), state);
	// число тактов
	curticks = tmTicks();
	state = utilFNV32(&curticks, sizeof(curticks), state);
	// еще?
	return state;
}